

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O2

void * __thiscall cppnet::PoolAlloter::ReFill(PoolAlloter *this,uint32_t size,uint32_t num)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  void *pvVar4;
  bool bVar5;
  uint32_t nums;
  uint32_t local_1c;
  
  uVar1 = (ulong)size;
  local_1c = num;
  pvVar2 = ChunkAlloc(this,size,&local_1c);
  if (local_1c != 1) {
    (this->_free_list).
    super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
    ._M_impl.super__Vector_impl_data._M_start[(size + 7 >> 3) - 1] =
         (MemNode *)((long)pvVar2 + uVar1);
    iVar3 = local_1c - 2;
    pvVar4 = pvVar2;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      *(void **)((long)pvVar4 + uVar1) = (void *)((long)pvVar4 + uVar1 * 2);
      pvVar4 = (void *)((long)pvVar4 + uVar1);
    }
    *(undefined8 *)((long)pvVar4 + uVar1) = 0;
  }
  return pvVar2;
}

Assistant:

void* PoolAlloter::ReFill(uint32_t size, uint32_t num) {
    uint32_t nums = num;

    char* chunk = (char*)ChunkAlloc(size, nums);

    MemNode* volatile* my_free;
    MemNode* res, *current, *next;
    if (1 == nums) {
        return chunk;
    }

    res = (MemNode*)chunk;
    
    my_free = &(_free_list[FreeListIndex(size)]);

    *my_free = next = (MemNode*)(chunk + size);
    for (uint32_t i = 1;; i++) {
        current = next;
        next = (MemNode*)((char*)next + size);
        if (nums - 1 == i) {
            current->_next = nullptr;
            break;

        } else {
            current->_next = next;
        }
    }
    return res;
}